

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O1

void __thiscall
Nova::Parse_Args::Add_Double_Argument
          (Parse_Args *this,string *arg_str,double default_value,string *val_name,string *desc)

{
  Arg_Data AStack_148;
  
  Arg_Data::Arg_Data(&AStack_148,arg_str,val_name,desc,default_value);
  std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::emplace_back<Nova::Arg_Data>
            (&this->arg_data_list,&AStack_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&AStack_148.list_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_148.string_value._M_dataplus._M_p != &AStack_148.string_value.field_2) {
    operator_delete(AStack_148.string_value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_148.string_default._M_dataplus._M_p != &AStack_148.string_default.field_2) {
    operator_delete(AStack_148.string_default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_148.desc._M_dataplus._M_p != &AStack_148.desc.field_2) {
    operator_delete(AStack_148.desc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_148.val_name._M_dataplus._M_p != &AStack_148.val_name.field_2) {
    operator_delete(AStack_148.val_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_148.str._M_dataplus._M_p != &AStack_148.str.field_2) {
    operator_delete(AStack_148.str._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Parse_Args::
Add_Double_Argument(const std::string& arg_str,double default_value,const std::string& val_name,const std::string& desc)
{
    arg_data_list.push_back(Arg_Data(arg_str,val_name,desc,default_value));
}